

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_0::LegalizeJSInterface::run::Fixer::create(Fixer *this)

{
  unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  *illegalImportsToLegal;
  Fixer *this_00;
  long in_RSI;
  
  illegalImportsToLegal =
       *(unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
         **)(in_RSI + 0x130);
  this_00 = (Fixer *)operator_new(0x138);
  wasm::(anonymous_namespace)::LegalizeJSInterface::run(wasm::Module*)::Fixer::Fixer(std::
  unordered_map<wasm::Name,wasm::Function*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
  allocator<std::pair<wasm::Name_const,wasm::Function_>_>_>__(this_00,illegalImportsToLegal);
  (this->super_WalkerPass<wasm::PostWalker<Fixer,_wasm::Visitor<Fixer,_void>_>_>).super_Pass.
  _vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
          return std::make_unique<Fixer>(illegalImportsToLegal);
        }